

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O2

MPP_RET hal_h264e_vepu510_init(void *hal,MppEncHalCfg *cfg)

{
  int iVar1;
  MppEncCfgSet *pMVar2;
  MPP_RET MVar3;
  uint uVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter %p\n","hal_h264e_vepu510_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar3 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar3 == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    iVar1 = cfg->task_cnt;
    *(int *)((long)hal + 0x14) = iVar1;
    if (1 < iVar1 - 1U) {
      _mpp_log_l(2,"hal_h264e_vepu510","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->task_cnt && p->task_cnt <= 2","hal_h264e_vepu510_init",0x126);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    MVar3 = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (MVar3 != MPP_OK) {
      pcVar8 = "init vepu buffer failed ret: %d\n";
      goto LAB_0021af29;
    }
    pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",(ulong)*(uint *)((long)hal + 0x14) * 0xe90);
    *(void **)((long)hal + 0x140) = pvVar5;
    if (pvVar5 == (void *)0x0) {
      pcVar8 = "init register buffer failed\n";
    }
    else {
      pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",(ulong)*(uint *)((long)hal + 0x14) * 0x60);
      *(void **)((long)hal + 0x148) = pvVar5;
      if (pvVar5 != (void *)0x0) {
        uVar4 = *(uint *)((long)hal + 0x14);
        if ((ulong)uVar4 < 2) {
LAB_0021b05d:
          *(undefined8 *)((long)hal + 0x1a0) = 0x2800000008;
          pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",(ulong)(uVar4 * 0x28));
          *(void **)((long)hal + 0x1a8) = pvVar5;
          if (pvVar5 != (void *)0x0) {
            pMVar2 = cfg->cfg;
            (pMVar2->hw).extra_buf = 1;
            (pMVar2->hw).qp_delta_row = 2;
            (pMVar2->hw).qp_delta_row_i = 1;
            (pMVar2->hw).qbias_i = 0x2ab;
            (pMVar2->hw).qbias_p = 0x155;
            (pMVar2->hw).qbias_en = 0;
            (pMVar2->hw).aq_thrd_i[0] = 0;
            (pMVar2->hw).aq_thrd_i[1] = 0;
            (pMVar2->hw).aq_thrd_i[2] = 0;
            (pMVar2->hw).aq_thrd_i[3] = 0;
            (pMVar2->hw).aq_thrd_i[4] = 3;
            (pMVar2->hw).aq_thrd_i[5] = 3;
            (pMVar2->hw).aq_thrd_i[6] = 5;
            (pMVar2->hw).aq_thrd_i[7] = 5;
            (pMVar2->hw).aq_thrd_i[8] = 8;
            (pMVar2->hw).aq_thrd_i[9] = 8;
            (pMVar2->hw).aq_thrd_i[10] = 8;
            (pMVar2->hw).aq_thrd_i[0xb] = 0xf;
            (pMVar2->hw).aq_thrd_i[0xc] = 0xf;
            (pMVar2->hw).aq_thrd_i[0xd] = 0x14;
            (pMVar2->hw).aq_thrd_i[0xe] = 0x19;
            (pMVar2->hw).aq_thrd_i[0xf] = 0x19;
            (pMVar2->hw).aq_thrd_p[0] = 0;
            (pMVar2->hw).aq_thrd_p[1] = 0;
            (pMVar2->hw).aq_thrd_p[2] = 0;
            (pMVar2->hw).aq_thrd_p[3] = 0;
            (pMVar2->hw).aq_thrd_p[4] = 3;
            (pMVar2->hw).aq_thrd_p[5] = 3;
            (pMVar2->hw).aq_thrd_p[6] = 5;
            (pMVar2->hw).aq_thrd_p[7] = 5;
            (pMVar2->hw).aq_thrd_p[8] = 8;
            (pMVar2->hw).aq_thrd_p[9] = 8;
            (pMVar2->hw).aq_thrd_p[10] = 8;
            (pMVar2->hw).aq_thrd_p[0xb] = 0xf;
            (pMVar2->hw).aq_thrd_p[0xc] = 0xf;
            (pMVar2->hw).aq_thrd_p[0xd] = 0x14;
            (pMVar2->hw).aq_thrd_p[0xe] = 0x19;
            (pMVar2->hw).aq_thrd_p[0xf] = 0x19;
            (pMVar2->hw).aq_step_i[0xc] = 4;
            (pMVar2->hw).aq_step_i[0xd] = 5;
            (pMVar2->hw).aq_step_i[0xe] = 7;
            (pMVar2->hw).aq_step_i[0xf] = 8;
            (pMVar2->hw).aq_step_i[8] = 0;
            (pMVar2->hw).aq_step_i[9] = 1;
            (pMVar2->hw).aq_step_i[10] = 2;
            (pMVar2->hw).aq_step_i[0xb] = 3;
            (pMVar2->hw).aq_step_i[4] = -4;
            (pMVar2->hw).aq_step_i[5] = -3;
            (pMVar2->hw).aq_step_i[6] = -2;
            (pMVar2->hw).aq_step_i[7] = -1;
            (pMVar2->hw).aq_step_i[0] = -8;
            (pMVar2->hw).aq_step_i[1] = -7;
            (pMVar2->hw).aq_step_i[2] = -6;
            (pMVar2->hw).aq_step_i[3] = -5;
            (pMVar2->hw).aq_step_p[0xc] = 4;
            (pMVar2->hw).aq_step_p[0xd] = 5;
            (pMVar2->hw).aq_step_p[0xe] = 7;
            (pMVar2->hw).aq_step_p[0xf] = 8;
            (pMVar2->hw).aq_step_p[8] = 0;
            (pMVar2->hw).aq_step_p[9] = 1;
            (pMVar2->hw).aq_step_p[10] = 2;
            (pMVar2->hw).aq_step_p[0xb] = 3;
            (pMVar2->hw).aq_step_p[4] = -4;
            (pMVar2->hw).aq_step_p[5] = -3;
            (pMVar2->hw).aq_step_p[6] = -2;
            (pMVar2->hw).aq_step_p[7] = -1;
            (pMVar2->hw).aq_step_p[0] = -8;
            (pMVar2->hw).aq_step_p[1] = -7;
            (pMVar2->hw).aq_step_p[2] = -6;
            (pMVar2->hw).aq_step_p[3] = -5;
            for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
              (pMVar2->hw).mode_bias[lVar7] = 8;
            }
            (pMVar2->hw).skip_sad = 8;
            (pMVar2->hw).skip_bias = 8;
            mpp_dev_multi_offset_init((MppDevRegOffCfgs **)((long)hal + 0x38),0x18);
            *(MppCbCtx **)((long)hal + 0x198) = cfg->output_cb;
            cfg->cap_recn_out = 1;
            lVar7 = 0;
            for (uVar9 = 0; uVar9 < *(uint *)((long)hal + 0x14); uVar9 = uVar9 + 1) {
              h264e_vepu_stream_amend_init
                        ((HalH264eVepuStreamAmend *)(*(long *)((long)hal + 0x148) + lVar7));
              lVar7 = lVar7 + 0x60;
            }
            puVar6 = (undefined8 *)mpp_osal_malloc("vepu510_h264e_tune_init",0x18);
            if (puVar6 != (undefined8 *)0x0) {
              *puVar6 = hal;
              *(undefined4 *)(puVar6 + 1) = 0xffffffff;
              *(undefined4 *)((long)puVar6 + 0xc) = 0xffffffff;
              *(undefined4 *)(puVar6 + 2) = 0xffffffff;
              *(undefined4 *)((long)puVar6 + 0x14) = 0xffffffff;
            }
            *(undefined8 **)((long)hal + 0x420) = puVar6;
            MVar3 = MPP_OK;
            goto LAB_0021af45;
          }
          pcVar8 = "init poll cfg buffer failed\n";
          goto LAB_0021b191;
        }
        pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",(ulong)uVar4 * 0x28);
        *(void **)((long)hal + 0x150) = pvVar5;
        if (pvVar5 != (void *)0x0) {
          pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",
                                   (ulong)*(uint *)((long)hal + 0x14) * 0x90);
          *(void **)((long)hal + 0x158) = pvVar5;
          if (pvVar5 != (void *)0x0) {
            pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",0x10c);
            *(void **)((long)hal + 0x80) = pvVar5;
            if (pvVar5 != (void *)0x0) {
              pvVar5 = mpp_osal_malloc("hal_h264e_vepu510_init",0xbc);
              *(void **)((long)hal + 0x88) = pvVar5;
              if (pvVar5 != (void *)0x0) {
                uVar4 = *(uint *)((long)hal + 0x14);
                goto LAB_0021b05d;
              }
            }
          }
        }
      }
      pcVar8 = "init amend data failed\n";
    }
LAB_0021b191:
    _mpp_log_l(2,"hal_h264e_vepu510",pcVar8,"hal_h264e_vepu510_init");
    MVar3 = MPP_ERR_MALLOC;
  }
  else {
    pcVar8 = "mpp_dev_init failed. ret: %d\n";
LAB_0021af29:
    _mpp_log_l(2,"hal_h264e_vepu510",pcVar8,"hal_h264e_vepu510_init",(ulong)(uint)MVar3);
  }
  hal_h264e_vepu510_deinit(hal);
LAB_0021af45:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave %p\n","hal_h264e_vepu510_init",hal);
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_h264e_vepu510_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu510Ctx *p = (HalH264eVepu510Ctx *)hal;
    MPP_RET ret = MPP_OK;
    RK_U32 i;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;
    p->task_cnt = cfg->task_cnt;
    mpp_assert(p->task_cnt && p->task_cnt <= MAX_TASK_CNT);

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    p->regs_sets = mpp_malloc(HalVepu510RegSet, p->task_cnt);
    if (NULL == p->regs_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init register buffer failed\n");
        goto DONE;
    }

    p->amend_sets = mpp_malloc(HalH264eVepuStreamAmend, p->task_cnt);
    if (NULL == p->amend_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init amend data failed\n");
        goto DONE;
    }

    if (p->task_cnt > 1) {
        p->prefix_sets = mpp_malloc(H264ePrefixNal, p->task_cnt);
        if (NULL == p->prefix_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->slice_sets = mpp_malloc(H264eSlice, p->task_cnt);
        if (NULL == p->slice_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->reorder = mpp_malloc(H264eReorderInfo, 1);
        if (NULL == p->reorder) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->marking = mpp_malloc(H264eMarkingInfo, 1);
        if (NULL == p->marking) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }
    }

    p->poll_slice_max = 8;
    p->poll_cfg_size = (sizeof(p->poll_cfgs) + sizeof(RK_S32) * p->poll_slice_max);
    p->poll_cfgs = mpp_malloc_size(MppDevPollCfg, p->poll_cfg_size * p->task_cnt);
    if (NULL == p->poll_cfgs) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init poll cfg buffer failed\n");
        goto DONE;
    }

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 1;
        hw->qp_delta_row    = 2;
        hw->extra_buf       = 1;
        hw->qbias_i         = 683;
        hw->qbias_p         = 341;
        hw->qbias_en        = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));

        for (i = 0; i < MPP_ARRAY_ELEMS(hw->mode_bias); i++)
            hw->mode_bias[i] = 8;

        hw->skip_sad  = 8;
        hw->skip_bias = 8;
    }

    mpp_dev_multi_offset_init(&p->offsets, 24);
    p->output_cb = cfg->output_cb;
    cfg->cap_recn_out = 1;
    for (i = 0; i < p->task_cnt; i++)
        h264e_vepu_stream_amend_init(&p->amend_sets[i]);

    p->tune = vepu510_h264e_tune_init(p);

DONE:
    if (ret)
        hal_h264e_vepu510_deinit(hal);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}